

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void releaseInodeInfo(unixFile *pFile)

{
  unixInodeInfo *p;
  unixInodeInfo *pInode;
  unixFile *pFile_local;
  
  p = pFile->pInode;
  if ((p != (unixInodeInfo *)0x0) && (p->nRef = p->nRef + -1, p->nRef == 0)) {
    closePendingFds(pFile);
    if (p->pPrev == (unixInodeInfo *)0x0) {
      inodeList = p->pNext;
    }
    else {
      p->pPrev->pNext = p->pNext;
    }
    if (p->pNext != (unixInodeInfo *)0x0) {
      p->pNext->pPrev = p->pPrev;
    }
    unqlite_free(p);
  }
  return;
}

Assistant:

static void releaseInodeInfo(unixFile *pFile){
  unixInodeInfo *pInode = pFile->pInode;
  if( pInode ){
    pInode->nRef--;
    if( pInode->nRef==0 ){
      closePendingFds(pFile);
      if( pInode->pPrev ){
        pInode->pPrev->pNext = pInode->pNext;
      }else{
        inodeList = pInode->pNext;
      }
      if( pInode->pNext ){
        pInode->pNext->pPrev = pInode->pPrev;
      }
      unqlite_free(pInode);
    }
  }
}